

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeFunction * __thiscall
ExpressionContext::GetFunctionType
          (ExpressionContext *this,SynBase *source,TypeBase *returnType,
          ArrayView<ArgumentData> arguments)

{
  TypeBase *node;
  IntrusiveList<TypeHandle> arguments_00;
  bool bVar1;
  uint uVar2;
  ArgumentData *pAVar3;
  TypeHandle *this_00;
  ArrayView<ArgumentData> arguments_01;
  byte local_9d;
  byte local_89;
  uint local_74;
  undefined1 auStack_70 [4];
  uint i_1;
  IntrusiveList<TypeHandle> argumentTypes;
  TypeFunction *prev;
  TypeBase *curr;
  uint i;
  uint hash;
  TypeBase *returnType_local;
  SynBase *source_local;
  ExpressionContext *this_local;
  ArrayView<ArgumentData> arguments_local;
  
  this_local = (ExpressionContext *)arguments.data;
  arguments_local.data._0_4_ = arguments.count;
  bVar1 = isType<TypeArgumentSet>(returnType);
  local_89 = 0;
  if (!bVar1) {
    bVar1 = isType<TypeMemberSet>(returnType);
    local_89 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeFunctionSet>(returnType);
      local_89 = bVar1 ^ 0xff;
    }
  }
  if ((local_89 & 1) == 0) {
    __assert_fail("!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x773,
                  "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                 );
  }
  bVar1 = isType<TypeError>(returnType);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isType<TypeError>(returnType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x774,
                  "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                 );
  }
  curr._4_4_ = returnType->nameHash;
  curr._0_4_ = 0;
  while( true ) {
    uVar2 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&this_local);
    if (uVar2 <= (uint)curr) {
      argumentTypes.tail = (TypeHandle *)this_local;
      arguments_01.count = (uint)arguments_local.data;
      arguments_01.data = (ArgumentData *)this_local;
      arguments_01._12_4_ = 0;
      arguments_local._8_8_ =
           GetFunctionTypeFromCache(&this->functionTypeMap,curr._4_4_,returnType,arguments_01);
      if ((TypeFunction *)arguments_local._8_8_ == (TypeFunction *)0x0) {
        IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)auStack_70);
        for (local_74 = 0;
            uVar2 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&this_local),
            local_74 < uVar2; local_74 = local_74 + 1) {
          this_00 = get<TypeHandle>(this);
          pAVar3 = ArrayView<ArgumentData>::operator[]
                             ((ArrayView<ArgumentData> *)&this_local,local_74);
          TypeHandle::TypeHandle(this_00,pAVar3->type);
          IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)auStack_70,this_00);
        }
        arguments_00.tail = argumentTypes.head;
        arguments_00.head = _auStack_70;
        arguments_local._8_8_ = GetFunctionType(this,source,returnType,arguments_00);
      }
      return (TypeFunction *)arguments_local._8_8_;
    }
    pAVar3 = ArrayView<ArgumentData>::operator[]((ArrayView<ArgumentData> *)&this_local,(uint)curr);
    node = pAVar3->type;
    bVar1 = isType<TypeArgumentSet>(node);
    local_9d = 0;
    if (!bVar1) {
      bVar1 = isType<TypeMemberSet>(node);
      local_9d = 0;
      if (!bVar1) {
        bVar1 = isType<TypeFunctionSet>(node);
        local_9d = bVar1 ^ 0xff;
      }
    }
    if ((local_9d & 1) == 0) {
      __assert_fail("!isType<TypeArgumentSet>(curr) && !isType<TypeMemberSet>(curr) && !isType<TypeFunctionSet>(curr)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x77e,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                   );
    }
    bVar1 = isType<TypeError>(node);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!isType<TypeError>(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x77f,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
                   );
    }
    if (node == this->typeAuto) break;
    curr._4_4_ = curr._4_4_ * 3 + node->nameHash;
    curr._0_4_ = (uint)curr + 1;
  }
  __assert_fail("curr != typeAuto",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x782,
                "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, ArrayView<ArgumentData>)"
               );
}

Assistant:

TypeFunction* ExpressionContext::GetFunctionType(SynBase *source, TypeBase* returnType, ArrayView<ArgumentData> arguments)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType));
	assert(!isType<TypeError>(returnType));

	unsigned hash = returnType->nameHash;

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		TypeBase *curr = arguments[i].type;

		(void)curr;

		assert(!isType<TypeArgumentSet>(curr) && !isType<TypeMemberSet>(curr) && !isType<TypeFunctionSet>(curr));
		assert(!isType<TypeError>(curr));

		// Can't have auto as argument
		assert(curr != typeAuto);

		hash = (hash << 1) + hash + curr->nameHash;
	}

	if(TypeFunction *prev = GetFunctionTypeFromCache(functionTypeMap, hash, returnType, arguments))
		return prev;

	IntrusiveList<TypeHandle> argumentTypes;

	for(unsigned i = 0; i < arguments.size(); i++)
		argumentTypes.push_back(new (get<TypeHandle>()) TypeHandle(arguments[i].type));

	return GetFunctionType(source, returnType, argumentTypes);
}